

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O1

int mriStep_GetCurrentGamma(ARKodeMem ark_mem,sunrealtype *gamma)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_10;
  
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_GetCurrentGamma",&local_10);
  if (iVar1 == 0) {
    *gamma = local_10->gamma;
  }
  return iVar1;
}

Assistant:

int mriStep_GetCurrentGamma(ARKodeMem ark_mem, sunrealtype* gamma)
{
  int retval;
  ARKodeMRIStepMem step_mem;
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }
  *gamma = step_mem->gamma;
  return (retval);
}